

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arange.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  float *pfVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  int i;
  float *output;
  int n_threads;
  ggml_cgraph *graph;
  ggml_gallocr_t galloc;
  ggml_tensor *t;
  ggml_context *ctx;
  ggml_init_params params;
  int num_tensors;
  ggml_backend_t backend;
  bool use_gpu;
  undefined8 uVar9;
  int local_8c;
  undefined7 uStack_2f;
  
  lVar2 = ggml_tensor_overhead();
  lVar2 = lVar2 * 2 + 0x200000;
  uVar3 = ggml_backend_cpu_init();
  uVar6 = CONCAT71(uStack_2f,1);
  uVar9 = 0;
  uVar4 = ggml_init();
  lVar5 = ggml_arange(0,0x40400000,0x3f800000,uVar4);
  if (*(long *)(lVar5 + 0x10) != 3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-arange.cpp"
               ,0x3f,"GGML_ASSERT(%s) failed","t->ne[0] == 3",in_R8,in_R9,lVar2,uVar9,uVar6);
  }
  uVar6 = ggml_backend_get_default_buffer_type(uVar3);
  uVar6 = ggml_gallocr_new(uVar6);
  uVar9 = ggml_new_graph(uVar4);
  ggml_build_forward_expand(uVar9,lVar5);
  ggml_gallocr_alloc_graph(uVar6,uVar9);
  uVar7 = ggml_backend_is_cpu(uVar3);
  if ((uVar7 & 1) != 0) {
    ggml_backend_cpu_set_n_threads(uVar3,4);
  }
  ggml_backend_graph_compute(uVar3,uVar9);
  uVar7 = ggml_nelements(lVar5);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pfVar8 = (float *)operator_new__(uVar7);
  uVar9 = ggml_nbytes(lVar5);
  ggml_backend_tensor_get(lVar5,pfVar8,0,uVar9);
  for (local_8c = 0; (long)local_8c < *(long *)(lVar5 + 0x10); local_8c = local_8c + 1) {
    printf("%.2f ",(double)pfVar8[local_8c]);
  }
  printf("\n");
  if ((*pfVar8 != 0.0) || (NAN(*pfVar8))) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-arange.cpp"
               ,0x59,"GGML_ASSERT(%s) failed","output[0] == 0");
  }
  if ((pfVar8[1] != 1.0) || (NAN(pfVar8[1]))) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-arange.cpp"
               ,0x5a,"GGML_ASSERT(%s) failed","output[1] == 1");
  }
  if ((pfVar8[2] != 2.0) || (NAN(pfVar8[2]))) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-arange.cpp"
               ,0x5b,"GGML_ASSERT(%s) failed","output[2] == 2");
  }
  if (pfVar8 != (float *)0x0) {
    operator_delete__(pfVar8);
  }
  ggml_free(uVar4);
  ggml_gallocr_free(uVar6);
  ggml_backend_free(uVar3);
  return 0;
}

Assistant:

int main(int /*argc*/, const char** /*argv*/) {
    {
        bool use_gpu = true;
        GGML_UNUSED(use_gpu);

        ggml_backend_t backend = NULL;
        //ggml_backend_buffer_t buffer;

        #ifdef GGML_USE_CUDA
        if (use_gpu) {
            fprintf(stderr, "%s: using CUDA backend\n", __func__);
            backend = ggml_backend_cuda_init(0);
            if (!backend) {
                fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
            }
        }
        #endif

        #ifdef GGML_USE_METAL
        if (!backend) {
            fprintf(stderr, "%s: using Metal backend\n", __func__);
            backend = ggml_backend_metal_init();
            if (!backend) {
                fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
            }
        }
        #endif

        const int num_tensors = 2;

        struct ggml_init_params params = {
                /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors + 2 * 1024 * 1024,
                /*.mem_size   =*/ NULL,
                /*.mem_size   =*/ true,
        };

        if (!backend) {
            // fallback to CPU backend
            backend = ggml_backend_cpu_init();
        }

        // create context
        struct ggml_context* ctx = ggml_init(params);
        struct ggml_tensor * t = ggml_arange(ctx, 0, 3, 1);

        GGML_ASSERT(t->ne[0] == 3);

        ggml_gallocr_t galloc = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, t);

        // allocate tensors
        ggml_gallocr_alloc_graph(galloc, graph);

        int n_threads = 4;

        if (ggml_backend_is_cpu(backend)) {
            ggml_backend_cpu_set_n_threads(backend, n_threads);
        }

        ggml_backend_graph_compute(backend, graph);

        float * output = new float[ggml_nelements(t)];
        ggml_backend_tensor_get(t, output, 0, ggml_nbytes(t));

        for (int i = 0; i < t->ne[0]; i++) {
            printf("%.2f ", output[i]);
        }
        printf("\n");

        GGML_ASSERT(output[0] == 0);
        GGML_ASSERT(output[1] == 1);
        GGML_ASSERT(output[2] == 2);

        delete[] output;
        ggml_free(ctx);
        ggml_gallocr_free(galloc);
        ggml_backend_free(backend);
    }

    return 0;
}